

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

size_t __thiscall flexbuffers::Builder::EndVector(Builder *this,size_t start,bool typed,bool fixed)

{
  size_type_conflict sVar1;
  anon_union_8_3_83789bcb_for_Value_0 local_30;
  Value vec;
  bool fixed_local;
  bool typed_local;
  size_t start_local;
  Builder *this_local;
  
  vec.min_bit_width_._2_1_ = fixed;
  vec.min_bit_width_._3_1_ = typed;
  sVar1 = std::vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>::
          size(&this->stack_);
  _local_30 = CreateVector(this,start,sVar1 - start,1,(bool)(vec.min_bit_width_._3_1_ & 1),
                           (bool)(vec.min_bit_width_._2_1_ & 1),(Value *)0x0);
  std::vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>::resize
            (&this->stack_,start);
  std::vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>::push_back
            (&this->stack_,(value_type *)&local_30);
  return local_30.i_;
}

Assistant:

size_t EndVector(size_t start, bool typed, bool fixed) {
    auto vec = CreateVector(start, stack_.size() - start, 1, typed, fixed);
    // Remove temp elements and return vector.
    stack_.resize(start);
    stack_.push_back(vec);
    return static_cast<size_t>(vec.u_);
  }